

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

void Sophus::defaultEnsure<Eigen::Transpose<Eigen::Matrix<float,4,1,0,4,1>>>
               (char *function,char *file,int line,char *description,
               Transpose<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *args)

{
  ostream *this;
  Transpose<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *args_00;
  string local_50;
  Transpose<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *local_30;
  Transpose<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *args_local;
  char *description_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  char *function_local;
  
  args_00 = (Transpose<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(ulong)(uint)line;
  local_30 = args;
  args_local = (Transpose<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)description;
  description_local._4_4_ = line;
  pcStack_18 = file;
  file_local = function;
  printf("Sophus ensure failed in function \'%s\', file \'%s\', line %d.\n",function,file);
  details::FormatString<Eigen::Transpose<Eigen::Matrix<float,4,1,0,4,1>>>
            (&local_50,(details *)args_local,(char *)local_30,args_00);
  this = std::operator<<((ostream *)&std::cout,(string *)&local_50);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_50);
  abort();
}

Assistant:

SOPHUS_FUNC void defaultEnsure(char const* function, char const* file, int line,
                               char const* description, Args&&... args) {
  std::printf("Sophus ensure failed in function '%s', file '%s', line %d.\n",
              function, file, line);
#ifdef __CUDACC__
  std::printf("%s", description);
#else
  std::cout << details::FormatString(description, std::forward<Args>(args)...)
            << std::endl;
  std::abort();
#endif
}